

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O2

void __thiscall
choc::text::FloatToStringBuffer<double>::Limits::Limits(Limits *this,MantissaAndExponent value)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  uint64_t uVar4;
  int iVar5;
  
  uVar4 = value.mantissa;
  iVar5 = value.exponent + -0xb;
  for (uVar2 = uVar4 * 2 + 1; (uVar2 >> 0x35 & 1) == 0; uVar2 = uVar2 * 2) {
    iVar5 = iVar5 + -1;
  }
  cVar1 = (char)value.exponent + -1;
  if (uVar4 == 0x10000000000000) {
    cVar1 = (char)value.exponent + -2;
  }
  lVar3 = 0x3fffffffffffff;
  if (uVar4 != 0x10000000000000) {
    lVar3 = uVar4 * 2 + -1;
  }
  (this->upper).mantissa = uVar2 << 10;
  (this->upper).exponent = iVar5;
  (this->lower).mantissa = lVar3 << (cVar1 - (char)iVar5 & 0x3fU);
  (this->lower).exponent = iVar5;
  return;
}

Assistant:

constexpr Limits (MantissaAndExponent value)
        {
            upper = { (value.mantissa << 1) + 1, value.exponent - 1 };

            while ((upper.mantissa & (hiddenBit << 1)) == 0)
                upper = upper.shiftedUp (1);

            upper = upper.shiftedUp (static_cast<int> (sizeof (upper.mantissa) * 8 - numSignificandBits - 2));

            lower = value.mantissa == hiddenBit ? MantissaAndExponent { (value.mantissa << 2) - 1, value.exponent - 2 }
                                                : MantissaAndExponent { (value.mantissa << 1) - 1, value.exponent - 1 };
            lower.mantissa <<= lower.exponent - upper.exponent;
            lower.exponent = upper.exponent;
        }